

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *this;
  size_t *psVar1;
  pointer *this_00;
  bool bVar2;
  int _x;
  ostream *poVar3;
  size_type sVar4;
  reference peVar5;
  Vec<unsigned_char,_3> *pVVar6;
  Vec<unsigned_char,_3> *pVVar7;
  ulong uVar8;
  reference pvVar9;
  int in_R8D;
  _InputArray local_660;
  allocator local_641;
  string local_640 [32];
  Scalar_<double> local_620;
  Point_<int> local_600;
  Point_<int> local_5f8;
  _InputOutputArray local_5f0;
  int local_5d4;
  int local_5d0;
  int i;
  int c_1;
  int r_1;
  int c;
  int r;
  Mat matches;
  int height;
  uint cnt_match;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> matchKP2;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> matchKP1;
  allocator local_509;
  string local_508 [32];
  _InputArray local_4e8;
  allocator local_4c9;
  string local_4c8 [32];
  Scalar_<double> local_4a8;
  Point_ local_488 [8];
  _InputOutputArray local_480;
  reference local_468;
  extrema *e_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<extrema,_std::allocator<extrema>_> *__range1_1;
  Point_ local_428 [8];
  _InputOutputArray local_420;
  undefined1 local_408 [8];
  extrema e;
  iterator __end1;
  iterator __begin1;
  vector<extrema,_std::allocator<extrema>_> *__range1;
  _InputArray local_368;
  _InputArray local_350;
  allocator local_331;
  string local_330 [32];
  Mat local_310;
  undefined1 local_2b0 [8];
  Mat colorfulImage2;
  Mat image2;
  _InputArray local_1d8;
  _InputArray local_1c0;
  allocator local_191;
  string local_190 [32];
  Mat local_170;
  uint local_110;
  uint local_10c;
  uint n_pixels2;
  uint n_pixels1;
  Mat colorfulImage;
  Mat image;
  vector<extrema,_std::allocator<extrema>_> ex2;
  vector<extrema,_std::allocator<extrema>_> ex1;
  char **argv_local;
  int argc_local;
  
  std::vector<extrema,_std::allocator<extrema>_>::vector
            ((vector<extrema,_std::allocator<extrema>_> *)
             &ex2.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<extrema,_std::allocator<extrema>_>::vector
            ((vector<extrema,_std::allocator<extrema>_> *)(image.step.buf + 1));
  cv::Mat::Mat((Mat *)(colorfulImage.step.buf + 1));
  cv::Mat::Mat((Mat *)&n_pixels2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"/Users/hsjimwang/Desktop/SIFT/cookbeef1.jpg",&local_191);
  cv::imread((string *)&local_170,(int)local_190);
  cv::Mat::operator=((Mat *)&n_pixels2,&local_170);
  cv::Mat::~Mat(&local_170);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  cv::_InputArray::_InputArray(&local_1c0,(Mat *)&n_pixels2);
  cv::_OutputArray::_OutputArray((_OutputArray *)&local_1d8,(Mat *)(colorfulImage.step.buf + 1));
  cv::cvtColor((cv *)&local_1c0,&local_1d8,(_OutputArray *)0x6,0,in_R8D);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&local_1d8);
  cv::_InputArray::~_InputArray(&local_1c0);
  rescale((Mat *)&n_pixels2,(Mat *)(colorfulImage.step.buf + 1));
  SIFTDescript((vector<extrema,_std::allocator<extrema>_> *)(image2.step.buf + 1),
               (Mat *)(colorfulImage.step.buf + 1),&local_10c);
  psVar1 = image2.step.buf + 1;
  std::vector<extrema,_std::allocator<extrema>_>::operator=
            ((vector<extrema,_std::allocator<extrema>_> *)
             &ex2.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<extrema,_std::allocator<extrema>_> *)psVar1);
  std::vector<extrema,_std::allocator<extrema>_>::~vector
            ((vector<extrema,_std::allocator<extrema>_> *)psVar1);
  poVar3 = std::operator<<((ostream *)&std::cout,"From ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_10c);
  std::operator<<(poVar3," point, ");
  poVar3 = std::operator<<((ostream *)&std::cout,"we extracted ");
  sVar4 = std::vector<extrema,_std::allocator<extrema>_>::size
                    ((vector<extrema,_std::allocator<extrema>_> *)
                     &ex2.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
  poVar3 = std::operator<<(poVar3," interest points.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  cv::Mat::Mat((Mat *)(colorfulImage2.step.buf + 1));
  cv::Mat::Mat((Mat *)local_2b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_330,"/Users/hsjimwang/Desktop/SIFT/cookbeef2.jpg",&local_331);
  cv::imread((string *)&local_310,(int)local_330);
  cv::Mat::operator=((Mat *)local_2b0,&local_310);
  cv::Mat::~Mat(&local_310);
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  cv::_InputArray::_InputArray(&local_350,(Mat *)local_2b0);
  cv::_OutputArray::_OutputArray((_OutputArray *)&local_368,(Mat *)(colorfulImage2.step.buf + 1));
  cv::cvtColor((cv *)&local_350,&local_368,(_OutputArray *)0x6,0,in_R8D);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&local_368);
  cv::_InputArray::~_InputArray(&local_350);
  rescale((Mat *)local_2b0,(Mat *)(colorfulImage2.step.buf + 1));
  SIFTDescript((vector<extrema,_std::allocator<extrema>_> *)&__range1,
               (Mat *)(colorfulImage2.step.buf + 1),&local_110);
  std::vector<extrema,_std::allocator<extrema>_>::operator=
            ((vector<extrema,_std::allocator<extrema>_> *)(image.step.buf + 1),
             (vector<extrema,_std::allocator<extrema>_> *)&__range1);
  std::vector<extrema,_std::allocator<extrema>_>::~vector
            ((vector<extrema,_std::allocator<extrema>_> *)&__range1);
  poVar3 = std::operator<<((ostream *)&std::cout,"From ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_110);
  std::operator<<(poVar3," point, ");
  poVar3 = std::operator<<((ostream *)&std::cout,"we extracted ");
  sVar4 = std::vector<extrema,_std::allocator<extrema>_>::size
                    ((vector<extrema,_std::allocator<extrema>_> *)(image.step.buf + 1));
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
  poVar3 = std::operator<<(poVar3," interest points.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  psVar1 = image.step.buf + 1;
  __end1 = std::vector<extrema,_std::allocator<extrema>_>::begin
                     ((vector<extrema,_std::allocator<extrema>_> *)psVar1);
  e.NeighborCells.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<extrema,_std::allocator<extrema>_>::end
                          ((vector<extrema,_std::allocator<extrema>_> *)psVar1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<extrema_*,_std::vector<extrema,_std::allocator<extrema>_>_>
                                *)&e.NeighborCells.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar2) break;
    peVar5 = __gnu_cxx::
             __normal_iterator<extrema_*,_std::vector<extrema,_std::allocator<extrema>_>_>::
             operator*(&__end1);
    extrema::extrema((extrema *)local_408,peVar5);
    cv::_InputOutputArray::_InputOutputArray(&local_420,(Mat *)local_2b0);
    cv::Point_::operator_cast_to_Point_(local_428);
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)&__range1_1,0.0,255.0,255.0,0.0);
    cv::circle(&local_420,local_428,3,&__range1_1,1,8,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_420);
    extrema::~extrema((extrema *)local_408);
    __gnu_cxx::__normal_iterator<extrema_*,_std::vector<extrema,_std::allocator<extrema>_>_>::
    operator++(&__end1);
  }
  this = &ex2.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
  __end1_1 = std::vector<extrema,_std::allocator<extrema>_>::begin
                       ((vector<extrema,_std::allocator<extrema>_> *)this);
  e_1 = (extrema *)
        std::vector<extrema,_std::allocator<extrema>_>::end
                  ((vector<extrema,_std::allocator<extrema>_> *)this);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<extrema_*,_std::vector<extrema,_std::allocator<extrema>_>_>
                        *)&e_1);
    if (!bVar2) break;
    local_468 = __gnu_cxx::
                __normal_iterator<extrema_*,_std::vector<extrema,_std::allocator<extrema>_>_>::
                operator*(&__end1_1);
    cv::_InputOutputArray::_InputOutputArray(&local_480,(Mat *)&n_pixels2);
    cv::Point_::operator_cast_to_Point_(local_488);
    cv::Scalar_<double>::Scalar_(&local_4a8,0.0,255.0,255.0,0.0);
    cv::circle(&local_480,local_488,3,&local_4a8,1,8,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_480);
    __gnu_cxx::__normal_iterator<extrema_*,_std::vector<extrema,_std::allocator<extrema>_>_>::
    operator++(&__end1_1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c8,"show",&local_4c9);
  cv::_InputArray::_InputArray(&local_4e8,(Mat *)&n_pixels2);
  cv::imshow(local_4c8,&local_4e8);
  cv::_InputArray::~_InputArray(&local_4e8);
  std::__cxx11::string::~string(local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  cv::waitKey(0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_508,"show",&local_509);
  cv::_InputArray::_InputArray
            ((_InputArray *)
             &matchKP1.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Mat *)local_2b0);
  cv::imshow(local_508,
             (_InputArray *)
             &matchKP1.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::_InputArray::~_InputArray
            ((_InputArray *)
             &matchKP1.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_508);
  std::allocator<char>::~allocator((allocator<char> *)&local_509);
  cv::waitKey(0);
  this_00 = &matchKP2.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)this_00);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&height);
  matches.step.buf[1]._4_4_ = 0;
  findMatches((vector<extrema,_std::allocator<extrema>_> *)
              &ex2.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
              (vector<extrema,_std::allocator<extrema>_> *)(image.step.buf + 1),
              (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)this_00,
              (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&height,
              (uint *)((long)matches.step.buf + 0xc));
  poVar3 = std::operator<<((ostream *)&std::cout,"We matched ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,matches.step.buf[1]._4_4_);
  poVar3 = std::operator<<(poVar3," pairs.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  matches.step.buf[1]._0_4_ = colorfulImage.flags;
  if (colorfulImage.flags < colorfulImage2.flags) {
    matches.step.buf[1]._0_4_ = colorfulImage2.flags;
  }
  cv::Mat::Mat((Mat *)&c,(int)matches.step.buf[1],colorfulImage.dims + colorfulImage2.dims,0x10);
  for (r_1 = 0; r_1 < colorfulImage.flags; r_1 = r_1 + 1) {
    for (c_1 = 0; c_1 < colorfulImage.dims; c_1 = c_1 + 1) {
      pVVar6 = cv::Mat::at<cv::Vec<unsigned_char,3>>((Mat *)&n_pixels2,r_1,c_1);
      pVVar7 = cv::Mat::at<cv::Vec<unsigned_char,3>>((Mat *)&c,r_1,c_1);
      *(undefined2 *)pVVar7 = *(undefined2 *)pVVar6;
      pVVar7[2] = pVVar6[2];
    }
  }
  for (i = 0; i < colorfulImage2.flags; i = i + 1) {
    for (local_5d0 = 0; local_5d0 < colorfulImage2.dims; local_5d0 = local_5d0 + 1) {
      pVVar6 = cv::Mat::at<cv::Vec<unsigned_char,3>>((Mat *)local_2b0,i,local_5d0);
      pVVar7 = cv::Mat::at<cv::Vec<unsigned_char,3>>((Mat *)&c,i,local_5d0 + colorfulImage.dims);
      *(undefined2 *)pVVar7 = *(undefined2 *)pVVar6;
      pVVar7[2] = pVVar6[2];
    }
  }
  local_5d4 = 0;
  while( true ) {
    uVar8 = (ulong)local_5d4;
    sVar4 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size
                      ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                       &matchKP2.
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (sVar4 <= uVar8) break;
    cv::_InputOutputArray::_InputOutputArray(&local_5f0,(Mat *)&c);
    pvVar9 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                       ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                        &matchKP2.
                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_5d4);
    cv::Point_<int>::Point_(&local_5f8,pvVar9);
    pvVar9 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                       ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&height,
                        (long)local_5d4);
    _x = pvVar9->x + colorfulImage.dims;
    pvVar9 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator[]
                       ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&height,
                        (long)local_5d4);
    cv::Point_<int>::Point_(&local_600,_x,pvVar9->y);
    cv::Scalar_<double>::Scalar_(&local_620,200.0,200.0,0.0,0.0);
    cv::line(&local_5f0,&local_5f8,&local_600,&local_620,1,8,0);
    cv::_InputOutputArray::~_InputOutputArray(&local_5f0);
    local_5d4 = local_5d4 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_640,"ShowMatches",&local_641);
  cv::_InputArray::_InputArray(&local_660,(Mat *)&c);
  cv::imshow(local_640,&local_660);
  cv::_InputArray::~_InputArray(&local_660);
  std::__cxx11::string::~string(local_640);
  std::allocator<char>::~allocator((allocator<char> *)&local_641);
  cv::waitKey(0);
  cv::Mat::~Mat((Mat *)&c);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&height);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
             &matchKP2.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::Mat::~Mat((Mat *)local_2b0);
  cv::Mat::~Mat((Mat *)(colorfulImage2.step.buf + 1));
  cv::Mat::~Mat((Mat *)&n_pixels2);
  cv::Mat::~Mat((Mat *)(colorfulImage.step.buf + 1));
  std::vector<extrema,_std::allocator<extrema>_>::~vector
            ((vector<extrema,_std::allocator<extrema>_> *)(image.step.buf + 1));
  std::vector<extrema,_std::allocator<extrema>_>::~vector
            ((vector<extrema,_std::allocator<extrema>_> *)
             &ex2.super__Vector_base<extrema,_std::allocator<extrema>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
    vector<extrema> ex1, ex2;
    Mat image, colorfulImage;
    unsigned n_pixels1, n_pixels2;
    colorfulImage = imread("/Users/hsjimwang/Desktop/SIFT/cookbeef1.jpg");
    cvtColor(colorfulImage, image, COLOR_BGR2GRAY);
    rescale(colorfulImage, image);
    ex1 = SIFTDescript(image, n_pixels1);
    cout << "From " << n_pixels1 << " point, ";
    cout << "we extracted " << ex1.size() << " interest points." << endl;

    Mat image2, colorfulImage2;
    colorfulImage2 = imread("/Users/hsjimwang/Desktop/SIFT/cookbeef2.jpg");
    cvtColor(colorfulImage2, image2, COLOR_BGR2GRAY);
    rescale(colorfulImage2, image2);
    ex2 = SIFTDescript(image2, n_pixels2);
    cout << "From " << n_pixels2 << " point, ";
    cout << "we extracted " << ex2.size() << " interest points." << endl;
    for(auto e:ex2){
        circle(colorfulImage2, e.pt, 3, Scalar(0,255,255));
    }

    for(const auto& e:ex1){
        circle(colorfulImage, e.pt, 3, Scalar(0,255,255));
    }

    imshow("show", colorfulImage);
    waitKey(0);
    imshow("show", colorfulImage2);
    waitKey(0);

    vector<Point> matchKP1, matchKP2;
    unsigned cnt_match = 0;
    findMatches(ex1, ex2, matchKP1, matchKP2, cnt_match);
    cout << "We matched " << cnt_match << " pairs." << endl;

    // Show the matches
    int height = colorfulImage.rows;
    if(colorfulImage.rows < colorfulImage2.rows) height = colorfulImage2.rows;
     Mat matches(height, colorfulImage.cols + colorfulImage2.cols, CV_8UC3);
    for(int r = 0; r < colorfulImage.rows; r++){
        for(int c = 0; c < colorfulImage.cols; c++)
            matches.at<Vec3b>(r,c) = colorfulImage.at<Vec3b>(r,c);
    }
    for(int r = 0; r < colorfulImage2.rows; r++){
        for(int c = 0; c < colorfulImage2.cols; c++)
            matches.at<Vec3b>(r,c+colorfulImage.cols) = colorfulImage2.at<Vec3b>(r,c);
    }
    for(int i=0; i<matchKP1.size(); i++){
        line(matches,matchKP1[i],Point(matchKP2[i].x+colorfulImage.cols, matchKP2[i].y),Scalar(200,200,0));
    }
    imshow("ShowMatches", matches);
    waitKey(0);
    return 0;
}